

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eventregister.cpp
# Opt level: O2

unique_ptr<Event,_std::default_delete<Event>_> * __thiscall
EventRegister::on(EventRegister *this,string *event)

{
  __uniq_ptr_impl<Event,_std::default_delete<Event>_> __p;
  iterator iVar1;
  mapped_type *pmVar2;
  __uniq_ptr_impl<Event,_std::default_delete<Event>_> *this_00;
  unique_ptr<Event,_std::default_delete<Event>_> ev;
  __uniq_ptr_impl<Event,_std::default_delete<Event>_> local_20;
  _Alloc_hider local_18;
  
  toLower(event);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
                  *)this,event);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_events)._M_t._M_impl.super__Rb_tree_header) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
             ::operator[](&this->m_events,event);
    return pmVar2;
  }
  local_18._M_p = (pointer)this;
  std::make_unique<Event,EventRegister*,std::__cxx11::string&>
            ((EventRegister **)&local_20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8);
  this_00 = (__uniq_ptr_impl<Event,_std::default_delete<Event>_> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
            ::operator[](&this->m_events,event);
  __p._M_t.super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
  super__Head_base<0UL,_Event_*,_false>._M_head_impl =
       local_20._M_t.super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
       super__Head_base<0UL,_Event_*,_false>._M_head_impl;
  local_20._M_t.super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
  super__Head_base<0UL,_Event_*,_false>._M_head_impl =
       (tuple<Event_*,_std::default_delete<Event>_>)
       (_Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>)0x0;
  std::__uniq_ptr_impl<Event,_std::default_delete<Event>_>::reset
            (this_00,(pointer)__p._M_t.super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
                              super__Head_base<0UL,_Event_*,_false>._M_head_impl);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
           ::operator[](&this->m_events,event);
  std::unique_ptr<Event,_std::default_delete<Event>_>::~unique_ptr
            ((unique_ptr<Event,_std::default_delete<Event>_> *)&local_20);
  return pmVar2;
}

Assistant:

const std::unique_ptr<Event> &EventRegister::on(std::string event)
{
    toLower(event);
    if (m_events.find(event) != m_events.end()) {
        return m_events[event];
    }

    std::unique_ptr<Event> ev = std::make_unique<Event>(this, event);
    m_events[event] = std::move(ev);
    return m_events[event];
}